

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

int should_send_max_streams(quicly_conn_t *conn,int uni)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  bool bVar5;
  
  bVar5 = uni == 0;
  bVar2 = !bVar5;
  if ((&(((conn->super).ctx)->transport_params).max_streams_bidi)[bVar2] != 0) {
    uVar3 = 1;
    if (((conn->egress).loss.largest_acked_packet_plus1[(ulong)bVar5 * 4 + -0xb] & 1) == 0) {
      lVar1 = (&(conn->super).remote.bidi)[bVar2].next_stream_id;
      lVar4 = lVar1 + 3;
      if (-1 < lVar1) {
        lVar4 = lVar1;
      }
      uVar3 = (uint)((long)(conn->egress).loss.largest_acked_packet_plus1
                           [(ulong)bVar5 * 4 +
                            ((ulong)((conn->egress).loss.largest_acked_packet_plus1
                                     [(ulong)bVar5 * 4 + -0xc] == 0) - 0xe)] <=
                    (long)(((ulong)(&(conn->super).remote.bidi)[bVar2].num_streams * 0x300 >> 10) +
                          (lVar4 >> 2)));
    }
    return uVar3;
  }
  return 0;
}

Assistant:

static int should_send_max_streams(quicly_conn_t *conn, int uni)
{
    uint64_t concurrency;
    quicly_maxsender_t *maxsender;
    struct st_quicly_conn_streamgroup_state_t *group;

#define INIT_VARS(type)                                                                                                            \
    do {                                                                                                                           \
        concurrency = conn->super.ctx->transport_params.max_streams_##type;                                                        \
        maxsender = &conn->ingress.max_streams.type;                                                                               \
        group = &conn->super.remote.type;                                                                                          \
    } while (0)
    if (uni) {
        INIT_VARS(uni);
    } else {
        INIT_VARS(bidi);
    }
#undef INIT_VARS

    if (concurrency == 0)
        return 0;

    if (!quicly_maxsender_should_send_max(maxsender, group->next_stream_id / 4, group->num_streams, 768))
        return 0;

    return 1;
}